

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint32_t rebuild_hflags_a64(CPUARMState_conflict *env,int el,int fp_el,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  uint32_t uVar2;
  ARMMMUIdx mmu_idx_00;
  int iVar3;
  int iVar4;
  TCR *pTVar5;
  ArchCPU_conflict2 *pAVar6;
  uint64_t uVar7;
  ulong uVar8;
  anon_struct_4_1_54a39816 v_9;
  anon_struct_4_1_54a39816 v_8;
  anon_struct_4_1_54a39816 v_7;
  anon_struct_4_1_54a39816 v_6;
  anon_struct_4_1_54a39816 v_5;
  anon_struct_4_1_54a39816_conflict1 v_4;
  anon_struct_4_1_54a39816_conflict v_3;
  uint32_t zcr_len;
  int sve_el;
  anon_struct_4_1_54a39816_conflict v_2;
  anon_struct_4_1_54a39816_conflict v_1;
  anon_struct_4_1_54a39816 v;
  int tbid;
  int tbii;
  uint64_t sctlr;
  uint64_t tcr;
  uint32_t local_20;
  ARMMMUIdx stage1;
  uint32_t flags;
  ARMMMUIdx mmu_idx_local;
  int fp_el_local;
  int el_local;
  CPUARMState_conflict *env_local;
  
  uVar2 = rebuild_hflags_aprofile(env);
  mmu_idx_00 = stage_1_mmu_idx(mmu_idx);
  pTVar5 = regime_tcr(env,mmu_idx);
  uVar7 = pTVar5->raw_tcr;
  uVar2 = deposit32(uVar2,0x1f,1,1);
  iVar3 = aa64_va_parameter_tbi(uVar7,mmu_idx);
  iVar4 = aa64_va_parameter_tbid(uVar7,mmu_idx);
  uVar2 = deposit32(uVar2,0,2,(uint)((byte)iVar3 & ((byte)iVar4 ^ 0xff) & 3));
  local_20 = deposit32(uVar2,0xc,2,(uint)((byte)iVar3 & 3));
  pAVar6 = env_archcpu(env);
  _Var1 = isar_feature_aa64_sve(&pAVar6->isar);
  if (_Var1) {
    iVar3 = sve_exception_el_aarch64(env,el);
    if ((iVar3 == 0) || (fp_el != 0)) {
      uVar2 = sve_zcr_len_for_el_aarch64(env,el);
      v_4._0_1_ = SUB41(uVar2,0);
    }
    else {
      v_4._0_1_ = 0;
    }
    uVar2 = deposit32(local_20,2,2,(uint)((byte)iVar3 & 3));
    local_20 = deposit32(uVar2,4,4,(uint)(v_4._0_1_ & 0xf));
  }
  uVar7 = regime_sctlr(env,mmu_idx_00);
  _Var1 = arm_cpu_data_is_big_endian_a64(el,uVar7);
  if (_Var1) {
    local_20 = deposit32(local_20,0x1c,1,1);
  }
  pAVar6 = env_archcpu(env);
  _Var1 = isar_feature_aa64_pauth(&pAVar6->isar);
  if ((_Var1) && ((uVar7 & 0xc8002000) != 0)) {
    local_20 = deposit32(local_20,8,1,1);
  }
  pAVar6 = env_archcpu(env);
  _Var1 = isar_feature_aa64_bti(&pAVar6->isar);
  if (_Var1) {
    uVar8 = 0x1000000000;
    if (el == 0) {
      uVar8 = 0x800000000;
    }
    if ((uVar7 & uVar8) != 0) {
      local_20 = deposit32(local_20,9,1,1);
    }
  }
  if ((env->pstate & 0x800000) != 0) goto LAB_007097ea;
  if (1 < mmu_idx - ARMMMUIdx_E10_1) {
    if (mmu_idx - ARMMMUIdx_E20_2 < 2) {
      if (((env->cp15).hcr_el2 & 0x8000000) != 0) {
        local_20 = deposit32(local_20,0xe,1,1);
      }
      goto LAB_007097ea;
    }
    if (mmu_idx != ARMMMUIdx_SE10_1 && mmu_idx != ARMMMUIdx_SE10_1_PAN) goto LAB_007097ea;
  }
  local_20 = deposit32(local_20,0xe,1,1);
LAB_007097ea:
  uVar2 = rebuild_hflags_common(env,fp_el,mmu_idx,local_20);
  return uVar2;
}

Assistant:

static uint32_t rebuild_hflags_a64(CPUARMState *env, int el, int fp_el,
                                   ARMMMUIdx mmu_idx)
{
    uint32_t flags = rebuild_hflags_aprofile(env);
    ARMMMUIdx stage1 = stage_1_mmu_idx(mmu_idx);
    uint64_t tcr = regime_tcr(env, mmu_idx)->raw_tcr;
    uint64_t sctlr;
    int tbii, tbid;

    FIELD_DP32(flags, TBFLAG_ANY, AARCH64_STATE, 1, flags);

    /* Get control bits for tagged addresses.  */
    tbid = aa64_va_parameter_tbi(tcr, mmu_idx);
    tbii = tbid & ~aa64_va_parameter_tbid(tcr, mmu_idx);

    FIELD_DP32(flags, TBFLAG_A64, TBII, tbii, flags);
    FIELD_DP32(flags, TBFLAG_A64, TBID, tbid, flags);

    if (cpu_isar_feature(aa64_sve, env_archcpu(env))) {
        int sve_el = sve_exception_el(env, el);
        uint32_t zcr_len;

        /*
         * If SVE is disabled, but FP is enabled,
         * then the effective len is 0.
         */
        if (sve_el != 0 && fp_el == 0) {
            zcr_len = 0;
        } else {
            zcr_len = sve_zcr_len_for_el(env, el);
        }
        FIELD_DP32(flags, TBFLAG_A64, SVEEXC_EL, sve_el, flags);
        FIELD_DP32(flags, TBFLAG_A64, ZCR_LEN, zcr_len, flags);
    }

    sctlr = regime_sctlr(env, stage1);

    if (arm_cpu_data_is_big_endian_a64(el, sctlr)) {
        FIELD_DP32(flags, TBFLAG_ANY, BE_DATA, 1, flags);
    }

    if (cpu_isar_feature(aa64_pauth, env_archcpu(env))) {
        /*
         * In order to save space in flags, we record only whether
         * pauth is "inactive", meaning all insns are implemented as
         * a nop, or "active" when some action must be performed.
         * The decision of which action to take is left to a helper.
         */
        if (sctlr & (SCTLR_EnIA | SCTLR_EnIB | SCTLR_EnDA | SCTLR_EnDB)) {
            FIELD_DP32(flags, TBFLAG_A64, PAUTH_ACTIVE, 1, flags);
        }
    }

    if (cpu_isar_feature(aa64_bti, env_archcpu(env))) {
        /* Note that SCTLR_EL[23].BT == SCTLR_BT1.  */
        if (sctlr & (el == 0 ? SCTLR_BT0 : SCTLR_BT1)) {
            FIELD_DP32(flags, TBFLAG_A64, BT, 1, flags);
        }
    }

    /* Compute the condition for using AccType_UNPRIV for LDTR et al. */
    if (!(env->pstate & PSTATE_UAO)) {
        switch (mmu_idx) {
        case ARMMMUIdx_E10_1:
        case ARMMMUIdx_E10_1_PAN:
        case ARMMMUIdx_SE10_1:
        case ARMMMUIdx_SE10_1_PAN:
            /* TODO: ARMv8.3-NV */
            FIELD_DP32(flags, TBFLAG_A64, UNPRIV, 1, flags);
            break;
        case ARMMMUIdx_E20_2:
        case ARMMMUIdx_E20_2_PAN:
            /* TODO: ARMv8.4-SecEL2 */
            /*
             * Note that EL20_2 is gated by HCR_EL2.E2H == 1, but EL20_0 is
             * gated by HCR_EL2.<E2H,TGE> == '11', and so is LDTR.
             */
            if (env->cp15.hcr_el2 & HCR_TGE) {
                FIELD_DP32(flags, TBFLAG_A64, UNPRIV, 1, flags);
            }
            break;
        default:
            break;
        }
    }

    return rebuild_hflags_common(env, fp_el, mmu_idx, flags);
}